

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O0

double double_conversion::RadixStringToIeee<3,char*>
                 (char **current,char *end,bool sign,uc16 separator,bool parse_as_hex_float,
                 bool allow_trailing_junk,double junk_string_value,bool read_as_double,
                 bool *result_is_junk)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  sbyte sVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  byte bVar11;
  undefined4 in_ECX;
  byte in_DL;
  bool sign_00;
  undefined8 *in_RDI;
  uint in_R8D;
  uint in_R9D;
  bool bVar12;
  double in_XMM0_Qa;
  double dVar13;
  byte in_stack_00000008;
  undefined1 *in_stack_00000010;
  double result;
  int written_exponent;
  bool is_negative;
  int middle_value;
  bool zero_tail;
  int dropped_bits;
  int dropped_bits_mask;
  int overflow_bits_count;
  int overflow;
  int digit;
  bool post_decimal;
  int radix;
  int exponent;
  int64_t number;
  int kSignificandSize;
  int kSingleSize;
  int kDoubleSize;
  char **in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff60;
  uc16 separator_00;
  Double *in_stack_ffffffffffffff70;
  DiyFp in_stack_ffffffffffffff78;
  int local_70;
  char local_61;
  int local_58;
  int local_54;
  int local_50;
  int local_44;
  uint64_t local_40;
  double local_8;
  
  sign_00 = (bool)(in_DL & 1);
  uVar8 = in_R8D & 1;
  uVar9 = in_R8D & 1;
  uVar2 = in_R8D & 1;
  uVar3 = in_R8D & 1;
  uVar5 = in_R8D & 1;
  uVar1 = in_R9D & 1;
  uVar4 = in_R9D & 1;
  sVar6 = 0x18;
  if ((in_stack_00000008 & 1) != 0) {
    sVar6 = 0x35;
  }
  *in_stack_00000010 = 1;
  local_40 = 0;
  local_44 = 0;
  bVar12 = false;
  while (*(char *)*in_RDI == '0') {
    bVar7 = Advance<char*>((char **)CONCAT44(in_ECX,in_R8D),(uc16)(in_R9D >> 0x10),
                           in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (bVar7) {
      *in_stack_00000010 = 0;
      dVar13 = SignedZero(sign_00);
      return dVar13;
    }
  }
LAB_009bb9ee:
  bVar7 = IsDecimalDigitForRadix((int)*(char *)*in_RDI,8);
  if (bVar7) {
    local_50 = *(char *)*in_RDI + -0x30;
    if (bVar12) {
      local_44 = local_44 + -3;
    }
  }
  else {
    bVar7 = IsCharacterDigitForRadix((int)*(char *)*in_RDI,8,'a');
    if (bVar7) {
      local_50 = *(char *)*in_RDI + -0x57;
      if (bVar12) {
        local_44 = local_44 + -3;
      }
    }
    else {
      bVar7 = IsCharacterDigitForRadix((int)*(char *)*in_RDI,8,'A');
      if (!bVar7) {
        if ((uVar8 == 0) || (*(char *)*in_RDI != '.')) {
          if ((((uVar9 == 0) || ((*(char *)*in_RDI != 'p' && (*(char *)*in_RDI != 'P')))) &&
              (uVar1 == 0)) &&
             (bVar12 = AdvanceToNonspace<char*>(in_stack_ffffffffffffff58,(char *)0x9bbb79), bVar12)
             ) {
            return in_XMM0_Qa;
          }
          goto LAB_009bbe16;
        }
        bVar12 = true;
        Advance<char*>((char **)CONCAT44(in_ECX,in_R8D),(uc16)(in_R9D >> 0x10),
                       in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        goto LAB_009bb9ee;
      }
      local_50 = *(char *)*in_RDI + -0x37;
      if (bVar12) {
        local_44 = local_44 + -3;
      }
    }
  }
  local_40 = local_40 * 8 + (long)local_50;
  local_54 = (int)((long)local_40 >> sVar6);
  if (local_54 == 0) {
    bVar7 = Advance<char*>((char **)CONCAT44(in_ECX,in_R8D),(uc16)(in_R9D >> 0x10),
                           in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (bVar7) goto LAB_009bbe16;
    goto LAB_009bb9ee;
  }
  local_58 = 1;
  for (; 1 < local_54; local_54 = local_54 >> 1) {
    local_58 = local_58 + 1;
  }
  bVar11 = (byte)local_58;
  uVar8 = (uint)local_40 & (1 << (bVar11 & 0x1f)) - 1U;
  local_40 = (long)local_40 >> (bVar11 & 0x3f);
  local_44 = local_58 + local_44;
  local_61 = '\x01';
  while (bVar7 = Advance<char*>((char **)CONCAT44(in_ECX,in_R8D),(uc16)(in_R9D >> 0x10),
                                in_stack_ffffffffffffff60,in_stack_ffffffffffffff58), !bVar7) {
    uVar9 = in_stack_ffffffffffffff60;
    if ((uVar2 != 0) && (*(char *)*in_RDI == '.')) {
      Advance<char*>((char **)CONCAT44(in_ECX,in_R8D),(uc16)(in_R9D >> 0x10),
                     in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      bVar12 = true;
      uVar9 = in_stack_ffffffffffffff60;
    }
    bVar7 = isDigit((int)*(char *)*in_RDI,8);
    in_stack_ffffffffffffff60 = uVar9;
    if (!bVar7) break;
    in_stack_ffffffffffffff60 = uVar9 & 0xffffff;
    if (local_61 != '\0') {
      in_stack_ffffffffffffff60 = CONCAT13(*(char *)*in_RDI == '0',(int3)uVar9);
    }
    local_61 = (char)(in_stack_ffffffffffffff60 >> 0x18);
    if (!bVar12) {
      local_44 = local_44 + 3;
    }
  }
  if (((uVar3 == 0) && (uVar4 == 0)) &&
     (bVar12 = AdvanceToNonspace<char*>(in_stack_ffffffffffffff58,(char *)0x9bbd35), bVar12)) {
    return in_XMM0_Qa;
  }
  uVar9 = 1 << (bVar11 - 1 & 0x1f);
  if ((int)uVar9 < (int)uVar8) {
    local_40 = local_40 + 1;
  }
  else if ((uVar8 == uVar9) && (((local_40 & 1) != 0 || (local_61 == '\0')))) {
    local_40 = local_40 + 1;
  }
  if ((local_40 & 1L << sVar6) != 0) {
    local_44 = local_44 + 1;
    local_40 = (long)local_40 >> 1;
  }
LAB_009bbe16:
  *in_stack_00000010 = 0;
  if (uVar5 != 0) {
    Advance<char*>((char **)CONCAT44(in_ECX,in_R8D),(uc16)(in_R9D >> 0x10),in_stack_ffffffffffffff60
                   ,in_stack_ffffffffffffff58);
    bVar12 = false;
    separator_00 = (uc16)(in_R9D >> 0x10);
    if (*(char *)*in_RDI == '+') {
      Advance<char*>((char **)CONCAT44(in_ECX,in_R8D),separator_00,in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff58);
    }
    else {
      bVar12 = *(char *)*in_RDI == '-';
      if (bVar12) {
        Advance<char*>((char **)CONCAT44(in_ECX,in_R8D),separator_00,in_stack_ffffffffffffff60,
                       in_stack_ffffffffffffff58);
      }
    }
    local_70 = 0;
    do {
      bVar7 = IsDecimalDigitForRadix((int)*(char *)*in_RDI,10);
      if (!bVar7) break;
      iVar10 = local_70;
      if (local_70 < 1) {
        iVar10 = -local_70;
      }
      if (iVar10 < 0x17bb1) {
        local_70 = local_70 * 10 + (int)*(char *)*in_RDI + -0x30;
      }
      bVar7 = Advance<char*>((char **)CONCAT44(in_ECX,in_R8D),(uc16)(in_R9D >> 0x10),
                             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    } while (!bVar7);
    if (bVar12) {
      local_70 = -local_70;
    }
    local_44 = local_70 + local_44;
  }
  if ((local_44 == 0) || (local_40 == 0)) {
    if (sign_00 != false) {
      if (local_40 == 0) {
        return -0.0;
      }
      local_40 = -local_40;
    }
    local_8 = (double)(long)local_40;
  }
  else {
    DiyFp::DiyFp((DiyFp *)&stack0xffffffffffffff70,local_40,local_44);
    Double::Double(in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
    local_8 = Double::value((Double *)0x9bbfeb);
    if (sign_00 != false) {
      local_8 = -local_8;
    }
  }
  return local_8;
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                uc16 separator,
                                bool parse_as_hex_float,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  DOUBLE_CONVERSION_ASSERT(*current != end);
  DOUBLE_CONVERSION_ASSERT(!parse_as_hex_float ||
      IsHexFloatString(*current, end, separator, allow_trailing_junk));

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);
  // Whether we have encountered a '.' and are parsing the decimal digits.
  // Only relevant if parse_as_hex_float is true.
  bool post_decimal = false;

  // Skip leading 0s.
  while (**current == '0') {
    if (Advance(current, separator, radix, end)) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  while (true) {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (parse_as_hex_float && **current == '.') {
      post_decimal = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
      continue;
    } else if (parse_as_hex_float && (**current == 'p' || **current == 'P')) {
      break;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent += overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        if (Advance(current, separator, radix, end)) break;
        if (parse_as_hex_float && **current == '.') {
          // Just run over the '.'. We are just trying to see whether there is
          // a non-zero digit somewhere.
          Advance(current, separator, radix, end);
          DOUBLE_CONVERSION_ASSERT(*current != end);
          post_decimal = true;
        }
        if (!isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        if (!post_decimal) exponent += radix_log_2;
      }

      if (!parse_as_hex_float &&
          !allow_trailing_junk &&
          AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    if (Advance(current, separator, radix, end)) break;
  }

  DOUBLE_CONVERSION_ASSERT(number < ((int64_t)1 << kSignificandSize));
  DOUBLE_CONVERSION_ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (parse_as_hex_float) {
    DOUBLE_CONVERSION_ASSERT(**current == 'p' || **current == 'P');
    Advance(current, separator, radix, end);
    DOUBLE_CONVERSION_ASSERT(*current != end);
    bool is_negative = false;
    if (**current == '+') {
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    } else if (**current == '-') {
      is_negative = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    }
    int written_exponent = 0;
    while (IsDecimalDigitForRadix(**current, 10)) {
      // No need to read exponents if they are too big. That could potentially overflow
      // the `written_exponent` variable.
      if (abs(written_exponent) <= 100 * Double::kMaxExponent) {
        written_exponent = 10 * written_exponent + **current - '0';
      }
      if (Advance(current, separator, radix, end)) break;
    }
    if (is_negative) written_exponent = -written_exponent;
    exponent += written_exponent;
  }

  if (exponent == 0 || number == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  DOUBLE_CONVERSION_ASSERT(number != 0);
  double result = Double(DiyFp(number, exponent)).value();
  return sign ? -result : result;
}